

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

Vec_Ptr_t * populateSafetyAssertionVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pNode;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  long lVar9;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pVVar7 = pNtk->vPos;
  if (pVVar7->nSize < 1) {
    uVar8 = 0;
  }
  else {
    lVar9 = 0;
    uVar8 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar7->pArray[lVar9];
      iVar4 = nodeName_starts_with(pNode,"assert_safety");
      if ((iVar4 != 0) || (iVar4 = nodeName_starts_with(pNode,"Assert"), iVar4 != 0)) {
        if (pAig->vCos->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pAig->vCos->pArray[lVar9];
        uVar1 = pVVar5->nSize;
        uVar2 = pVVar5->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_00623876;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar4;
        }
LAB_00623876:
        pVVar5->nSize = uVar1 + 1;
        pVVar5->pArray[(int)uVar1] = pvVar3;
        uVar8 = uVar8 + 1;
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pNtk->vPos;
    } while (lVar9 < pVVar7->nSize);
  }
  printf("Number of safety property found = %d\n",(ulong)uVar8);
  return pVVar5;
}

Assistant:

Vec_Ptr_t * populateSafetyAssertionVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, assertSafetyCounter = 0;
    Vec_Ptr_t * vAssertSafety;

    vAssertSafety = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        //if( strstr( Abc_ObjName( pNode ), "Assert") != NULL )
        if( nodeName_starts_with( pNode, "assert_safety" ) || nodeName_starts_with( pNode, "Assert" ))
        {
            Vec_PtrPush( vAssertSafety, Aig_ManCo( pAig, i ) );
            assertSafetyCounter++;
        }
    printf("Number of safety property found = %d\n", assertSafetyCounter);
    return vAssertSafety;
}